

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  bool bVar7;
  long in_RSI;
  int in_EDI;
  string command;
  int in_stack_00000044;
  char **in_stack_00000298;
  int in_stack_000002a4;
  char **in_stack_000002d8;
  int in_stack_000002e4;
  char *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  fasttext::utils::initTables();
  if (local_8 < 2) {
    printUsage();
    exit(1);
  }
  pcVar1 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffa7,
                                   CONCAT16(in_stack_ffffffffffffffa6,
                                            CONCAT15(in_stack_ffffffffffffffa5,
                                                     CONCAT14(in_stack_ffffffffffffffa4,
                                                              CONCAT13(in_stack_ffffffffffffffa3,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  CONCAT11(in_stack_ffffffffffffffa1,
                                                           in_stack_ffffffffffffffa0))))))),
                          in_stack_ffffffffffffff98);
  if ((((bool)uVar2) ||
      (uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffa6,
                                                       CONCAT15(in_stack_ffffffffffffffa5,
                                                                CONCAT14(in_stack_ffffffffffffffa4,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           CONCAT11(in_stack_ffffffffffffffa1,
                                                                    in_stack_ffffffffffffffa0)))))))
                               ,in_stack_ffffffffffffff98), (bool)uVar3)) ||
     (uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffffa5,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(in_stack_ffffffffffffffa3,
                                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                              in_stack_ffffffffffffff98), (bool)uVar4)) {
    train(in_stack_00000044,_command);
  }
  else {
    uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(in_stack_ffffffffffffffa3,
                                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                            in_stack_ffffffffffffff98);
    if ((bool)uVar5) {
      test(in_stack_000002a4,in_stack_00000298);
    }
    else {
      uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           CONCAT11(in_stack_ffffffffffffffa1,
                                                                    in_stack_ffffffffffffffa0)))))))
                              ,in_stack_ffffffffffffff98);
      if ((bool)uVar6) {
        printVectors(in_stack_00000044,_command);
      }
      else {
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  CONCAT13(uVar6,CONCAT12(in_stack_ffffffffffffffa2,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                                in_stack_ffffffffffffff98);
        if ((!bVar7) &&
           (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  CONCAT13(uVar6,CONCAT12(bVar7,CONCAT11(
                                                  in_stack_ffffffffffffffa1,
                                                  in_stack_ffffffffffffffa0))))))),
                                    in_stack_ffffffffffffff98), !bVar7)) {
          printUsage();
          exit(1);
        }
        predict(in_stack_000002e4,in_stack_000002d8);
      }
    }
  }
  fasttext::utils::freeTables();
  local_4 = 0;
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  utils::initTables();
  if (argc < 2) {
    printUsage();
    exit(EXIT_FAILURE);
  }
  std::string command(argv[1]);
  if (command == "skipgram" || command == "cbow" || command == "supervised") {
    train(argc, argv);
  } else if (command == "test") {
    test(argc, argv);
  } else if (command == "print-vectors") {
    printVectors(argc, argv);
  } else if (command == "predict" || command == "predict-prob" ) {
    predict(argc, argv);
  } else {
    printUsage();
    exit(EXIT_FAILURE);
  }
  utils::freeTables();
  return 0;
}